

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O2

void ScaleARGBRowDown2Linear_SSE2
               (uint8_t *src_argb,ptrdiff_t src_stride,uint8_t *dst_argb,int dst_width)

{
  uint8_t *puVar1;
  bool bVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  uint8_t *puVar25;
  uint8_t *puVar26;
  uint8_t *puVar27;
  uint8_t *puVar28;
  uint8_t *puVar29;
  uint8_t *puVar30;
  uint8_t *puVar31;
  uint8_t *puVar32;
  int iVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint8_t uVar42;
  uint8_t uVar43;
  uint8_t uVar44;
  uint8_t uVar45;
  uint8_t uVar46;
  uint8_t uVar47;
  uint8_t uVar48;
  uint8_t uVar49;
  
  do {
    uVar34 = *src_argb;
    puVar3 = src_argb + 1;
    puVar4 = src_argb + 2;
    puVar5 = src_argb + 3;
    puVar6 = src_argb + 4;
    puVar7 = src_argb + 5;
    puVar8 = src_argb + 6;
    puVar9 = src_argb + 7;
    puVar10 = src_argb + 8;
    puVar11 = src_argb + 9;
    puVar12 = src_argb + 10;
    puVar13 = src_argb + 0xb;
    puVar14 = src_argb + 0xc;
    puVar15 = src_argb + 0xd;
    puVar16 = src_argb + 0xe;
    puVar17 = src_argb + 0xf;
    puVar1 = src_argb + 0x10;
    puVar18 = src_argb + 0x11;
    puVar19 = src_argb + 0x12;
    puVar20 = src_argb + 0x13;
    puVar21 = src_argb + 0x14;
    puVar22 = src_argb + 0x15;
    puVar23 = src_argb + 0x16;
    puVar24 = src_argb + 0x17;
    puVar25 = src_argb + 0x18;
    puVar26 = src_argb + 0x19;
    puVar27 = src_argb + 0x1a;
    puVar28 = src_argb + 0x1b;
    puVar29 = src_argb + 0x1c;
    puVar30 = src_argb + 0x1d;
    puVar31 = src_argb + 0x1e;
    puVar32 = src_argb + 0x1f;
    src_argb = src_argb + 0x20;
    uVar34 = pavgb(uVar34,*puVar6);
    uVar35 = pavgb(*puVar3,*puVar7);
    uVar36 = pavgb(*puVar4,*puVar8);
    uVar37 = pavgb(*puVar5,*puVar9);
    uVar38 = pavgb(*puVar10,*puVar14);
    uVar39 = pavgb(*puVar11,*puVar15);
    uVar40 = pavgb(*puVar12,*puVar16);
    uVar41 = pavgb(*puVar13,*puVar17);
    uVar42 = pavgb(*puVar1,*puVar21);
    uVar43 = pavgb(*puVar18,*puVar22);
    uVar44 = pavgb(*puVar19,*puVar23);
    uVar45 = pavgb(*puVar20,*puVar24);
    uVar46 = pavgb(*puVar25,*puVar29);
    uVar47 = pavgb(*puVar26,*puVar30);
    uVar48 = pavgb(*puVar27,*puVar31);
    uVar49 = pavgb(*puVar28,*puVar32);
    *dst_argb = uVar34;
    dst_argb[1] = uVar35;
    dst_argb[2] = uVar36;
    dst_argb[3] = uVar37;
    dst_argb[4] = uVar38;
    dst_argb[5] = uVar39;
    dst_argb[6] = uVar40;
    dst_argb[7] = uVar41;
    dst_argb[8] = uVar42;
    dst_argb[9] = uVar43;
    dst_argb[10] = uVar44;
    dst_argb[0xb] = uVar45;
    dst_argb[0xc] = uVar46;
    dst_argb[0xd] = uVar47;
    dst_argb[0xe] = uVar48;
    dst_argb[0xf] = uVar49;
    dst_argb = dst_argb + 0x10;
    iVar33 = dst_width + -4;
    bVar2 = 3 < dst_width;
    dst_width = iVar33;
  } while (iVar33 != 0 && bVar2);
  return;
}

Assistant:

void ScaleARGBRowDown2Linear_SSE2(const uint8_t* src_argb,
                                  ptrdiff_t src_stride,
                                  uint8_t* dst_argb,
                                  int dst_width) {
  (void)src_stride;
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "shufps      $0x88,%%xmm1,%%xmm0           \n"
      "shufps      $0xdd,%%xmm1,%%xmm2           \n"
      "pavgb       %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1");
}